

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf.cpp
# Opt level: O0

void __thiscall
ins_ekf::InsEkf::InsEkf
          (InsEkf *this,Vector3d *imu_offset,Vector4d *imu_orientation,Vector3d *gps_offset,
          VectorXd *initial_state,double gps_rate)

{
  CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *pCVar1;
  Matrix<double,_5,_1,_0,_5,_1> *other;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar2;
  Matrix<double,_3,_1,_0,_3,_1> *other_00;
  size_t sVar3;
  size_t sVar4;
  Scalar *pSVar5;
  Type local_3f0;
  StorageBaseType local_3b3 [3];
  double local_3b0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_3a8;
  Type local_388;
  StorageBaseType local_34b [3];
  double local_348;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_340;
  Type local_320;
  StorageBaseType local_2e3 [3];
  double local_2e0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_2d8;
  Type local_2b8;
  StorageBaseType local_27b [3];
  double local_278;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_270;
  Type local_250;
  StorageBaseType local_213 [3];
  double local_210;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_208;
  Type local_1e8;
  Type local_1b0;
  Type local_178;
  Vector3d local_140;
  Vector4d local_128;
  Scalar local_108;
  Scalar local_100;
  Scalar local_f8;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_f0 [24];
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_d8;
  Scalar local_b8;
  Scalar local_b0;
  Scalar local_a8 [3];
  Scalar local_90;
  Scalar local_88;
  DenseBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> local_80 [40];
  CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> local_58;
  double local_38;
  double gps_rate_local;
  VectorXd *initial_state_local;
  Vector3d *gps_offset_local;
  Vector4d *imu_orientation_local;
  Vector3d *imu_offset_local;
  InsEkf *this_local;
  
  local_38 = gps_rate;
  gps_rate_local = (double)initial_state;
  initial_state_local = (VectorXd *)gps_offset;
  gps_offset_local = (Vector3d *)imu_orientation;
  imu_orientation_local = (Vector4d *)imu_offset;
  imu_offset_local = (Vector3d *)this;
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix(&this->orientation_);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->position_);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->velocity_);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->bias_g_);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->bias_a_);
  Eigen::Matrix<double,_15,_15,_0,_15,_15>::Matrix(&this->P_);
  this->accel_noise = 0.001;
  this->accel_rw = 0.001;
  this->gyro_noise = 0.00013;
  this->gyro_rw = 0.0001;
  this->gps_update_rate_ = local_38;
  Eigen::Matrix<double,_5,_1,_0,_5,_1>::Matrix((Matrix<double,_5,_1,_0,_5,_1> *)local_80);
  local_88 = 0.1;
  Eigen::DenseBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator<<(&local_58,local_80,&local_88);
  local_90 = 0.1;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_
                     (&local_58,&local_90);
  local_a8[0] = 0.1;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_
                     (pCVar1,local_a8);
  local_b0 = 0.2;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_
                     (pCVar1,&local_b0);
  local_b8 = 0.03;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_
                     (pCVar1,&local_b8);
  other = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::finished(pCVar1);
  Eigen::Matrix<double,_5,_1,_0,_5,_1>::Matrix(&this->Q_gps_,other);
  Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::~CommaInitializer(&local_58);
  Eigen::Matrix<double,_11,_1,_0,_11,_1>::Matrix(&this->last_measurements_);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_f0);
  local_f8 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<(&local_d8,local_f0,&local_f8);
  local_100 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (&local_d8,&local_100);
  local_108 = 9.81;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (pCVar2,&local_108);
  other_00 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished(pCVar2);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->gravity_,other_00);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_d8);
  this->is_stationary_ = false;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (&this->imu_offset_,(Matrix<double,_3,_1,_0,_3,_1> *)imu_orientation_local);
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix
            (&this->imu_orientation_,(Matrix<double,_4,_1,_0,_4,_1> *)gps_offset_local);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (&this->gps_offset_,(Matrix<double,_3,_1,_0,_3,_1> *)initial_state_local);
  sVar3 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)initial_state);
  sVar4 = s_I(NUM_STATES);
  if (sVar3 == sVar4) {
    sVar3 = s_I(roll);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_178,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)initial_state,sVar3,
               3);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((Matrix<double,3,1,0,3,1> *)&local_140,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_178);
    RPYToQuat(&local_128,&local_140);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=(&this->orientation_,&local_128);
    sVar3 = s_I(x);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_1b0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)initial_state,sVar3,
               3);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)&this->position_,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_1b0);
    sVar3 = s_I(Vx);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_1e8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)initial_state,sVar3,
               3);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)&this->velocity_,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_1e8);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&this->bias_g_);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&this->bias_a_);
    Eigen::DenseBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_> *)&this->P_);
    local_210 = 10.0;
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
    Eigen::operator*(&local_208,&local_210,local_213);
    sVar3 = s_I(x);
    sVar4 = s_I(x);
    Eigen::DenseBase<Eigen::Matrix<double,15,15,0,15,15>>::block<int,int>
              (&local_250,(DenseBase<Eigen::Matrix<double,15,15,0,15,15>> *)&this->P_,sVar3,sVar4,3,
               3);
    Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false> *)&local_250,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                *)&local_208);
    local_278 = 0.008;
    Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
    Eigen::operator*(&local_270,&local_278,local_27b);
    sVar3 = s_I(roll);
    sVar4 = s_I(roll);
    Eigen::DenseBase<Eigen::Matrix<double,15,15,0,15,15>>::block<int,int>
              (&local_2b8,(DenseBase<Eigen::Matrix<double,15,15,0,15,15>> *)&this->P_,sVar3,sVar4,2,
               2);
    Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false> *)&local_2b8,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>_>
                *)&local_270);
    sVar3 = s_I(yaw);
    sVar4 = s_I(yaw);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_1> *)&this->P_,
                        sVar3,sVar4);
    *pSVar5 = 0.03;
    local_2e0 = 0.1;
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
    Eigen::operator*(&local_2d8,&local_2e0,local_2e3);
    sVar3 = s_I(Vx);
    sVar4 = s_I(Vx);
    Eigen::DenseBase<Eigen::Matrix<double,15,15,0,15,15>>::block<int,int>
              (&local_320,(DenseBase<Eigen::Matrix<double,15,15,0,15,15>> *)&this->P_,sVar3,sVar4,3,
               3);
    Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false> *)&local_320,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                *)&local_2d8);
    local_348 = 1e-07;
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
    Eigen::operator*(&local_340,&local_348,local_34b);
    sVar3 = s_I(biasGp);
    sVar4 = s_I(biasGp);
    Eigen::DenseBase<Eigen::Matrix<double,15,15,0,15,15>>::block<int,int>
              (&local_388,(DenseBase<Eigen::Matrix<double,15,15,0,15,15>> *)&this->P_,sVar3,sVar4,3,
               3);
    Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false> *)&local_388,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                *)&local_340);
    local_3b0 = 1e-08;
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
    Eigen::operator*(&local_3a8,&local_3b0,local_3b3);
    sVar3 = s_I(biasAx);
    sVar4 = s_I(biasAx);
    Eigen::DenseBase<Eigen::Matrix<double,15,15,0,15,15>>::block<int,int>
              (&local_3f0,(DenseBase<Eigen::Matrix<double,15,15,0,15,15>> *)&this->P_,sVar3,sVar4,3,
               3);
    Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false> *)&local_3f0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                *)&local_3a8);
    Eigen::DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_> *)&this->last_measurements_);
    return;
  }
  __assert_fail("initial_state.size() == s_I(SI::NUM_STATES)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/KWoiceshyn[P]ins_ekf/src/ins_ekf.cpp"
                ,0x14,
                "ins_ekf::InsEkf::InsEkf(const Eigen::Vector3d &, const Eigen::Vector4d &, const Eigen::Vector3d &, Eigen::VectorXd, double)"
               );
}

Assistant:

InsEkf::InsEkf(const Eigen::Vector3d& imu_offset, const Eigen::Vector4d& imu_orientation, const Eigen::Vector3d& gps_offset, Eigen::VectorXd initial_state, double gps_rate):
            imu_offset_{imu_offset},
            imu_orientation_{imu_orientation},
            gps_offset_{gps_offset},
            gps_update_rate_{gps_rate},
            Q_gps_{(Eigen::Matrix<double, 5, 1>() << 0.1, 0.1, 0.1, 0.2, 0.03).finished()},
            gravity_{(Eigen::Matrix<double, 3, 1>() << 0.0, 0.0, 9.81).finished()},
            is_stationary_{false}
    {

        assert(initial_state.size() == s_I(SI::NUM_STATES));
        orientation_ = RPYToQuat(initial_state.segment(s_I(SI::roll), 3));
        position_ = initial_state.segment(s_I(SI::x), 3);
        velocity_ = initial_state.segment(s_I(SI::Vx), 3);
        bias_g_.setZero();
        bias_a_.setZero();

        // initialize state covariance matrix
        P_.setZero();
        P_.block(s_I(SI::x), s_I(SI::x), 3, 3) = 10.0 * Eigen::Matrix3d::Identity(); // xyz
        P_.block(s_I(SI::roll), s_I(SI::roll), 2 , 2) = 8e-3 * Eigen::Matrix2d::Identity(); // roll, pitch
        P_(s_I(SI::yaw), s_I(SI::yaw)) = 3e-2; // yaw
        P_.block(s_I(SI::Vx), s_I(SI::Vx), 3 , 3) = 0.1 * Eigen::Matrix3d::Identity(); // Vxyz
        P_.block(s_I(SI::biasGp), s_I(SI::biasGp), 3, 3) = 1e-7 * Eigen::Matrix3d::Identity(); // biasGpqr
        P_.block(s_I(SI::biasAx), s_I(SI::biasAx), 3, 3) = 1e-8 * Eigen::Matrix3d::Identity(); // biasAxyz

        last_measurements_.setZero();
    }